

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::Initialize(cmCTestTestHandler *this)

{
  RegularExpression local_1c0;
  RegularExpression local_e0;
  cmCTestTestHandler *local_10;
  cmCTestTestHandler *this_local;
  
  local_10 = this;
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  this->ElapsedTestingTime = -1.0;
  std::
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  ::clear(&this->TestResults);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomTestsIgnore);
  std::__cxx11::string::operator=((string *)&this->StartTest,"");
  std::__cxx11::string::operator=((string *)&this->EndTest,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPreTest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPostTest);
  this->CustomMaximumPassedTestOutputSize = 0x400;
  this->CustomMaximumFailedTestOutputSize = 0x4b000;
  std::vector<int,_std::allocator<int>_>::clear(&this->TestsToRun);
  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  cmsys::RegularExpression::RegularExpression(&local_e0,"");
  cmsys::RegularExpression::operator=(&this->IncludeLabelRegularExpression,&local_e0);
  cmsys::RegularExpression::~RegularExpression(&local_e0);
  cmsys::RegularExpression::RegularExpression(&local_1c0,"");
  cmsys::RegularExpression::operator=(&this->ExcludeLabelRegularExpression,&local_1c0);
  cmsys::RegularExpression::~RegularExpression(&local_1c0);
  std::__cxx11::string::operator=((string *)&this->IncludeRegExp,"");
  std::__cxx11::string::operator=((string *)&this->ExcludeRegExp,"");
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::operator=((string *)&this->TestsToRunString,"");
  this->UseUnion = false;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::clear(&this->TestList);
  return;
}

Assistant:

void cmCTestTestHandler::Initialize()
{
  this->Superclass::Initialize();

  this->ElapsedTestingTime = -1;

  this->TestResults.clear();

  this->CustomTestsIgnore.clear();
  this->StartTest = "";
  this->EndTest = "";

  this->CustomPreTest.clear();
  this->CustomPostTest.clear();
  this->CustomMaximumPassedTestOutputSize = 1 * 1024;
  this->CustomMaximumFailedTestOutputSize = 300 * 1024;

  this->TestsToRun.clear();

  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  this->IncludeLabelRegularExpression = "";
  this->ExcludeLabelRegularExpression = "";
  this->IncludeRegExp = "";
  this->ExcludeRegExp = "";
  this->ExcludeFixtureRegExp.clear();
  this->ExcludeFixtureSetupRegExp.clear();
  this->ExcludeFixtureCleanupRegExp.clear();

  TestsToRunString = "";
  this->UseUnion = false;
  this->TestList.clear();
}